

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O2

deFunctionPtr __thiscall
tcu::CompositeFunctionLibrary::getFunction(CompositeFunctionLibrary *this,char *name)

{
  deFunctionPtr p_Var1;
  long lVar2;
  int ndx;
  long lVar3;
  
  lVar2 = 0;
  lVar3 = 0;
  do {
    if (this->m_numLibraries <= lVar3) {
      return (deFunctionPtr)0x0;
    }
    p_Var1 = (deFunctionPtr)
             (**(code **)(*(long *)((long)&this->m_libraries->_vptr_FunctionLibrary + lVar2) + 0x10)
             )((long)&this->m_libraries->_vptr_FunctionLibrary + lVar2,name);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 8;
  } while (p_Var1 == (deFunctionPtr)0x0);
  return p_Var1;
}

Assistant:

deFunctionPtr CompositeFunctionLibrary::getFunction (const char* name) const
{
	for (int ndx = 0; ndx < m_numLibraries; ndx++)
	{
		const deFunctionPtr ptr = m_libraries[ndx].getFunction(name);
		if (ptr)
			return ptr;
	}
	return DE_NULL;
}